

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O1

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
               (TypeErasedState *state,ForwardedParameterType<std::basic_string_view<char>_> args,
               ForwardedParameterType<google::protobuf::io::Printer::SourceLocation> args_1)

{
  AccessorVerifier *pAVar1;
  ulong uVar2;
  long *__s1;
  int iVar3;
  undefined8 uVar4;
  AccessorVerifier *pAVar5;
  size_type __rlen;
  
  pAVar1 = (AccessorVerifier *)(state->remote).target;
  uVar2 = args->_M_len;
  __s1 = (long *)args->_M_str;
  if (uVar2 == 0xc) {
    iVar3 = bcmp(__s1,"release_name",0xc);
joined_r0x0026997d:
    if (iVar3 == 0) {
      google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker(pAVar1,pAVar1,1)
      ;
      pAVar5 = (AccessorVerifier *)&pAVar1->needs_weak_descriptor_pin_;
      uVar4 = 1;
      goto LAB_002699e5;
    }
  }
  else if (uVar2 == 4) {
    iVar3 = bcmp(__s1,"name",4);
    goto joined_r0x0026997d;
  }
  if ((uVar2 < 8) || (pAVar5 = pAVar1, *__s1 != 0x657461746f6e6e61)) {
    if ((uVar2 != 0x15) || (iVar3 = bcmp(__s1,"WeakDescriptorSelfPin",0x15), iVar3 != 0)) {
      return;
    }
    pAVar5 = (AccessorVerifier *)&pAVar1->needs_weak_descriptor_pin_;
  }
  uVar4 = 0;
LAB_002699e5:
  google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker(pAVar1,pAVar5,uVar4)
  ;
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}